

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Node * __thiscall rw::ColorQuant::findNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  Node *pNVar1;
  
  if (level == 0) {
    return root;
  }
  do {
    pNVar1 = root->children[addr & 0xf];
    if (pNVar1 == (Node *)0x0) {
      return root;
    }
    addr = addr >> 4;
    level = level + -1;
    root = pNVar1;
  } while (level != 0);
  return pNVar1;
}

Assistant:

ColorQuant::Node*
ColorQuant::findNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil)
		return root;

	return this->findNode(root->children[a], addr>>4, level-1);
}